

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O2

char * serial_serialize(serial s,value v,size_t *size,memory_allocator allocator)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uStack_30;
  
  if ((v == (value)0x0 || s == (serial)0x0) || size == (size_t *)0x0) {
    pcVar5 = "Invalid serialization arguments";
    pcVar4 = (char *)0x0;
    uStack_30 = 0x47;
  }
  else {
    lVar2 = plugin_iface();
    lVar2 = (**(code **)(lVar2 + 8))(allocator);
    if (lVar2 == 0) {
      pcVar5 = "Invalid serial implementation handle initialization";
      pcVar4 = (char *)0x0;
      uStack_30 = 0x50;
    }
    else {
      lVar3 = plugin_iface(s);
      pcVar4 = (char *)(**(code **)(lVar3 + 0x10))(lVar2,v,size);
      if (pcVar4 == (char *)0x0) {
        log_write_impl_va("metacall",0x59,"serial_serialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serial/source/serial.c"
                          ,3,"Invalid serial implementation handle serialization");
      }
      lVar3 = plugin_iface(s);
      iVar1 = (**(code **)(lVar3 + 0x20))(lVar2);
      if (iVar1 == 0) {
        return pcVar4;
      }
      pcVar5 = "Invalid serial implementation handle destruction";
      uStack_30 = 0x5e;
    }
  }
  log_write_impl_va("metacall",uStack_30,"serial_serialize",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serial/source/serial.c"
                    ,3,pcVar5);
  return pcVar4;
}

Assistant:

char *serial_serialize(serial s, value v, size_t *size, memory_allocator allocator)
{
	if (s == NULL || v == NULL || size == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serialization arguments");

		return NULL;
	}

	serial_handle handle = serial_iface(s)->initialize(allocator);

	if (handle == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serial implementation handle initialization");

		return NULL;
	}

	char *buffer = serial_iface(s)->serialize(handle, v, size);

	if (buffer == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serial implementation handle serialization");
	}

	if (serial_iface(s)->destroy(handle) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid serial implementation handle destruction");
	}

	return buffer;
}